

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyscope.cpp
# Opt level: O2

void polyscope::pushContext(function<void_()> *callbackFunction,bool drawDefaultUI)

{
  int iVar1;
  ImFontAtlas *shared_font_atlas;
  ImGuiContext *ctx;
  ImGuiIO *this;
  ImGuiIO *pIVar2;
  runtime_error *this_00;
  ulong uVar3;
  undefined1 local_60 [40];
  undefined1 local_38;
  
  shared_font_atlas = render::Engine::getImGuiGlobalFontAtlas(render::engine);
  ctx = ImGui::CreateContext(shared_font_atlas);
  this = ImGui::GetIO();
  ImGui::SetCurrentContext(ctx);
  render::Engine::setImGuiStyle(render::engine);
  pIVar2 = ImGui::GetIO();
  ImGuiIO::operator=(pIVar2,this);
  local_60._0_8_ = ctx;
  std::function<void_()>::function((function<void_()> *)(local_60 + 8),callbackFunction);
  local_38 = drawDefaultUI;
  std::
  vector<polyscope::(anonymous_namespace)::ContextEntry,_std::allocator<polyscope::(anonymous_namespace)::ContextEntry>_>
  ::push_back((vector<polyscope::(anonymous_namespace)::ContextEntry,_std::allocator<polyscope::(anonymous_namespace)::ContextEntry>_>
               *)local_60,(value_type *)callbackFunction);
  std::_Function_base::~_Function_base((_Function_base *)(local_60 + 8));
  if (0x32 < (ulong)((DAT_00480c20 - (anonymous_namespace)::contextStack) / 0x30)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,
               "Uh oh, polyscope::show() was recusively MANY times (depth > 50), this is probably a bug. Perhaps you are accidentally calling show every time polyscope::userCallback executes?"
              );
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (*render::engine->_vptr_Engine[0xf])();
  uVar3 = DAT_00480c20 - (anonymous_namespace)::contextStack;
  while (uVar3 <= (ulong)(DAT_00480c20 - (anonymous_namespace)::contextStack)) {
    mainLoopIteration();
    iVar1 = (*render::engine->_vptr_Engine[0x13])();
    if ((char)iVar1 != '\0') {
      popContext();
    }
  }
  pIVar2 = ImGui::GetIO();
  ImGuiIO::operator=(this,pIVar2);
  ImGui::DestroyContext(ctx);
  if ((anonymous_namespace)::contextStack != DAT_00480c20) {
    ImGui::SetCurrentContext(*(ImGuiContext **)(DAT_00480c20 + -0x30));
  }
  return;
}

Assistant:

void pushContext(std::function<void()> callbackFunction, bool drawDefaultUI) {

  // Create a new context and push it on to the stack
  ImGuiContext* newContext = ImGui::CreateContext(render::engine->getImGuiGlobalFontAtlas());
  ImGuiIO& oldIO = ImGui::GetIO(); // used to copy below, see note
  ImGui::SetCurrentContext(newContext);

  render::engine->setImGuiStyle();
  ImGui::GetIO() = oldIO; // Copy all of the old IO values to new. With ImGUI 1.76 (and some previous versions), this
                          // was necessary to fix a bug where keys like delete, etc would break in subcontexts. The
                          // problem was that the key mappings (e.g. GLFW_KEY_BACKSPACE --> ImGuiKey_Backspace) need to
                          // be populated in io.KeyMap, and these entries would get lost on creating a new context.
  contextStack.push_back(ContextEntry{newContext, callbackFunction, drawDefaultUI});

  if (contextStack.size() > 50) {
    // Catch bugs with nested show()
    throw std::runtime_error(
        "Uh oh, polyscope::show() was recusively MANY times (depth > 50), this is probably a bug. Perhaps "
        "you are accidentally calling show every time polyscope::userCallback executes?");
  };

  // Make sure the window is visible
  render::engine->showWindow();

  // Re-enter main loop until the context has been popped
  size_t currentContextStackSize = contextStack.size();
  while (contextStack.size() >= currentContextStackSize) {

    mainLoopIteration();

    // auto-exit if the window is closed
    if (render::engine->windowRequestsClose()) {
      popContext();
    }
  }

  oldIO = ImGui::GetIO(); // Copy new IO values to old. I haven't encountered anything that strictly requires this, but
                          // it feels like we should mirror the behavior from pushing.

  ImGui::DestroyContext(newContext);

  // Restore the previous context, if there was one
  if (!contextStack.empty()) {
    ImGui::SetCurrentContext(contextStack.back().context);
  }
}